

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_constant_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::EliminateDeadConstantPass::Process(EliminateDeadConstantPass *this)

{
  IRContext *pIVar1;
  Instruction *this_00;
  undefined1 auVar2 [8];
  code *pcVar3;
  uint32_t uVar4;
  uint32_t id;
  mapped_type *pmVar5;
  Operand *pOVar6;
  size_type sVar7;
  uint uVar8;
  pointer ppIVar9;
  code *pcVar10;
  pair<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_bool> pVar11;
  size_t count;
  Instruction *c;
  Instruction *def_inst;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_consts;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  working_list;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> constants;
  unordered_map<spvtools::opt::Instruction_*,_unsigned_long,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
  use_counts;
  undefined1 local_120 [8];
  spv_position_t local_118;
  Instruction *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  __node_base_ptr ap_Stack_c8 [2];
  _Any_data local_b8;
  long local_a8;
  long lStack_a0;
  undefined4 local_98;
  undefined8 local_90;
  __node_base_ptr p_Stack_88;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_80;
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_b8._M_unused._M_object = &p_Stack_88;
  local_b8._8_8_ = 1;
  local_a8 = 0;
  lStack_a0 = 0;
  local_98 = 0x3f800000;
  local_90 = 0;
  p_Stack_88 = (__node_base_ptr)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  Module::GetConstants
            (&local_80,
             (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if (local_80.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppIVar9 = local_80.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_118.line = (size_t)*ppIVar9;
      uVar4 = 0;
      if (*(bool *)(local_118.line + 0x2d) == true) {
        uVar4 = Instruction::GetSingleWordOperand
                          ((Instruction *)local_118.line,(uint)*(bool *)(local_118.line + 0x2c));
      }
      local_120 = (undefined1  [8])0x0;
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      local_f8._8_8_ = 0;
      local_f8._M_unused._M_object = local_120;
      pcStack_e0 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_constant_pass.cpp:40:19)>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_constant_pass.cpp:40:19)>
                 ::_M_manager;
      analysis::DefUseManager::ForEachUse
                ((pIVar1->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,uVar4,
                 (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_f8);
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,3);
      }
      auVar2 = local_120;
      pmVar5 = std::__detail::
               _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)(local_120 + 8));
      *pmVar5 = (mapped_type)auVar2;
      if (local_120 == (undefined1  [8])0x0) {
        local_f8._M_unused._M_object = &local_b8;
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_f8._M_unused._0_8_,local_120 + 8,&local_f8);
      }
      ppIVar9 = ppIVar9 + 1;
    } while (ppIVar9 !=
             local_80.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_f8._M_unused._M_object = ap_Stack_c8;
  local_f8._8_8_ = 1;
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_d8 = 0x3f800000;
  local_d0 = 0;
  ap_Stack_c8[0] = (__node_base_ptr)0x0;
  pcVar10 = local_e8;
  if (lStack_a0 != 0) {
    do {
      local_120 = *(undefined1 (*) [8])(local_a8 + 8);
      if (((ulong)((Instruction *)local_120)->opcode_ < 0x35) &&
         ((0x18100000000000U >> ((ulong)((Instruction *)local_120)->opcode_ & 0x3f) & 1) != 0)) {
        uVar8 = (((Instruction *)local_120)->has_result_id_ & 1) + 1;
        if (((Instruction *)local_120)->has_type_id_ == false) {
          uVar8 = (uint)((Instruction *)local_120)->has_result_id_;
        }
        if (uVar8 != (int)((ulong)((long)(((Instruction *)local_120)->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(((Instruction *)local_120)->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555) {
          uVar4 = 0;
          do {
            pOVar6 = Instruction::GetInOperand((Instruction *)local_120,uVar4);
            if (pOVar6->type == SPV_OPERAND_TYPE_ID) {
              uVar8 = (*(bool *)((long)local_120 + 0x2d) & 1) + 1;
              if (*(bool *)((long)local_120 + 0x2c) == false) {
                uVar8 = (uint)*(bool *)((long)local_120 + 0x2d);
              }
              id = Instruction::GetSingleWordOperand((Instruction *)local_120,uVar8 + uVar4);
              pIVar1 = (this->super_Pass).context_;
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar1);
              }
              local_100 = analysis::DefUseManager::GetDef
                                    ((pIVar1->def_use_mgr_)._M_t.
                                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                     .
                                     super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                     ._M_head_impl,id);
              sVar7 = std::
                      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::count(&local_68,&local_100);
              if (sVar7 != 0) {
                pmVar5 = std::__detail::
                         _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_100);
                if (*pmVar5 == 0) {
                  local_118.line = 0x50;
                  local_118.column = 0;
                  local_118.index = 0;
                  Log(&(this->super_Pass).consumer_,SPV_MSG_INTERNAL_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_constant_pass.cpp"
                      ,(spv_position_t *)(local_120 + 8),
                      "assertion failed: use_counts[def_inst] > 0");
                  exit(1);
                }
                pmVar5 = std::__detail::
                         _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_100);
                *pmVar5 = *pmVar5 - 1;
                pmVar5 = std::__detail::
                         _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_100);
                if (*pmVar5 == 0) {
                  local_118.line = (size_t)&local_b8;
                  std::
                  _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                            ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_118.line,&local_100,local_120 + 8);
                }
              }
            }
            uVar4 = uVar4 + 1;
            uVar8 = (*(bool *)((long)local_120 + 0x2d) & 1) + 1;
            if (*(bool *)((long)local_120 + 0x2c) == false) {
              uVar8 = (uint)*(bool *)((long)local_120 + 0x2d);
            }
          } while (uVar4 < (int)((ulong)((long)*(pointer *)((long)local_120 + 0x40) -
                                        (long)(((OperandList *)((long)local_120 + 0x38))->
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 4) *
                           -0x55555555 - uVar8);
        }
      }
      local_118.line = (size_t)&local_f8;
      pVar11 = std::
               _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                         ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)local_118.line,local_120,local_120 + 8);
      std::
      _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&local_b8,local_120,pVar11._8_8_);
      pcVar10 = local_e8;
    } while (lStack_a0 != 0);
  }
  for (; pcVar3 = pcStack_e0, pcVar10 != (code *)0x0; pcVar10 = (code *)*(undefined8 **)pcVar10) {
    this_00 = *(Instruction **)((long)pcVar10 + 8);
    pIVar1 = (this->super_Pass).context_;
    uVar4 = 0;
    if (this_00->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
    }
    IRContext::KillDef(pIVar1,uVar4);
  }
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_f8);
  if (local_80.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_unsigned_long>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b8);
  return (pcVar3 == (code *)0x0) + SuccessWithChange;
}

Assistant:

Pass::Status EliminateDeadConstantPass::Process() {
  std::unordered_set<Instruction*> working_list;
  // Traverse all the instructions to get the initial set of dead constants as
  // working list and count number of real uses for constants. Uses in
  // annotation instructions do not count.
  std::unordered_map<Instruction*, size_t> use_counts;
  std::vector<Instruction*> constants = context()->GetConstants();
  for (auto* c : constants) {
    uint32_t const_id = c->result_id();
    size_t count = 0;
    context()->get_def_use_mgr()->ForEachUse(
        const_id, [&count](Instruction* user, uint32_t index) {
          (void)index;
          spv::Op op = user->opcode();
          if (!(IsAnnotationInst(op) || IsDebug1Inst(op) || IsDebug2Inst(op) ||
                IsDebug3Inst(op))) {
            ++count;
          }
        });
    use_counts[c] = count;
    if (!count) {
      working_list.insert(c);
    }
  }

  // Start from the constants with 0 uses, back trace through the def-use chain
  // to find all dead constants.
  std::unordered_set<Instruction*> dead_consts;
  while (!working_list.empty()) {
    Instruction* inst = *working_list.begin();
    // Back propagate if the instruction contains IDs in its operands.
    switch (inst->opcode()) {
      case spv::Op::OpConstantComposite:
      case spv::Op::OpSpecConstantComposite:
      case spv::Op::OpSpecConstantOp:
        for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
          // SpecConstantOp instruction contains 'opcode' as its operand. Need
          // to exclude such operands when decreasing uses.
          if (inst->GetInOperand(i).type != SPV_OPERAND_TYPE_ID) {
            continue;
          }
          uint32_t operand_id = inst->GetSingleWordInOperand(i);
          Instruction* def_inst =
              context()->get_def_use_mgr()->GetDef(operand_id);
          // If the use_count does not have any count for the def_inst,
          // def_inst must not be a constant, and should be ignored here.
          if (!use_counts.count(def_inst)) {
            continue;
          }
          // The number of uses should never be less then 0, so it can not be
          // less than 1 before it decreases.
          SPIRV_ASSERT(consumer(), use_counts[def_inst] > 0);
          --use_counts[def_inst];
          if (!use_counts[def_inst]) {
            working_list.insert(def_inst);
          }
        }
        break;
      default:
        break;
    }
    dead_consts.insert(inst);
    working_list.erase(inst);
  }

  // Turn all dead instructions and uses of them to nop
  for (auto* dc : dead_consts) {
    context()->KillDef(dc->result_id());
  }
  return dead_consts.empty() ? Status::SuccessWithoutChange
                             : Status::SuccessWithChange;
}